

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SerialAnalyzerResults::GenerateFrameTabularText
          (SerialAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  byte bVar1;
  char *pcVar2;
  char *__format;
  bool bVar3;
  Frame frame;
  char number_str [128];
  char result_str [128];
  Frame local_150 [16];
  ulonglong local_140;
  byte local_12f;
  char local_128 [128];
  char local_a8 [128];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_150);
  bVar1 = local_12f;
  pcVar2 = local_128;
  AnalyzerHelpers::GetNumberString
            (local_140,display_base,
             (this->mSettings->mBitsPerTransfer - 1) +
             (uint)(this->mSettings->mSerialMode == Normal),pcVar2,0x80);
  if ((local_12f & 4) == 0) {
    if ((bVar1 & 2) == 0) {
      bVar3 = (bVar1 & 1) == 0;
      if (bVar3) goto LAB_001078a9;
      pcVar2 = "%s (parity error)";
      __format = "%s (framing error)";
    }
    else {
      bVar3 = (bVar1 & 1) == 0;
      pcVar2 = "%s (parity error)";
      __format = "%s (framing error & parity error)";
    }
  }
  else {
    bVar3 = (bVar1 & 1) == 0;
    pcVar2 = "Address: %s";
    __format = "Address: %s (framing error)";
  }
  if (bVar3) {
    __format = pcVar2;
  }
  pcVar2 = local_a8;
  snprintf(pcVar2,0x80,__format);
LAB_001078a9:
  AnalyzerResults::AddTabularText
            ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_150);
  return;
}

Assistant:

void SerialAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();
    Frame frame = GetFrame( frame_index );

    bool framing_error = false;
    if( ( frame.mFlags & FRAMING_ERROR_FLAG ) != 0 )
        framing_error = true;

    bool parity_error = false;
    if( ( frame.mFlags & PARITY_ERROR_FLAG ) != 0 )
        parity_error = true;

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer--;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, bits_per_transfer, number_str, 128 );

    char result_str[ 128 ];

    // MP mode address case:
    if( ( frame.mFlags & MP_MODE_ADDRESS_FLAG ) != 0 )
    {
        if( framing_error == false )
        {
            snprintf( result_str, sizeof( result_str ), "Address: %s", number_str );
            AddTabularText( result_str );
        }
        else
        {
            snprintf( result_str, sizeof( result_str ), "Address: %s (framing error)", number_str );
            AddTabularText( result_str );
        }
        return;
    }

    // normal case:
    if( ( parity_error == true ) || ( framing_error == true ) )
    {
        if( framing_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (parity error)", number_str );
        else if( parity_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (framing error)", number_str );
        else
            snprintf( result_str, sizeof( result_str ), "%s (framing error & parity error)", number_str );

        AddTabularText( result_str );
    }
    else
    {
        AddTabularText( number_str );
    }
}